

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

void __thiscall HMatrix::compute_matB_vec(HMatrix *this,double *vec,int *base,HVector *result)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  HVector::clear(result);
  piVar3 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar10 = this->numCol;
  uVar8 = this->numRow;
  piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar12 = 0;
  if (0 < (int)uVar8) {
    uVar12 = (ulong)uVar8;
  }
  for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
    dVar1 = vec[uVar11];
    if (1e-14 < ABS(dVar1)) {
      iVar14 = base[uVar11];
      if (iVar14 < iVar10) {
        iVar2 = piVar5[(long)iVar14 + 1];
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar13 = (long)piVar5[iVar14]; lVar13 < iVar2; lVar13 = lVar13 + 1) {
          iVar14 = piVar6[lVar13];
          pdVar4[iVar14] = pdVar7[lVar13] * dVar1 + pdVar4[iVar14];
        }
      }
      else {
        iVar14 = iVar14 - iVar10;
        pdVar4[iVar14] = dVar1 + pdVar4[iVar14];
      }
    }
  }
  iVar10 = 0;
  for (lVar13 = 0; lVar13 < (int)uVar8; lVar13 = lVar13 + 1) {
    if (ABS(pdVar4[lVar13]) <= 1e-14) {
      pdVar4[lVar13] = 0.0;
    }
    else {
      lVar9 = (long)iVar10;
      iVar10 = iVar10 + 1;
      piVar3[lVar9] = (int)lVar13;
      uVar8 = this->numRow;
    }
  }
  result->count = iVar10;
  return;
}

Assistant:

void HMatrix::compute_matB_vec(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];

    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = vec[i];
        if (fabs(value) > HSOL_CONST_TINY) {
            if (iCol < numCol) {
                for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                    resultArray[Aindex[k]] += value * Avalue[k];
            } else {
                resultArray[iCol - numCol] += value;
            }
        }
    }

    for (int i = 0; i < numRow; i++) {
        if (fabs(resultArray[i]) > HSOL_CONST_TINY) {
            resultIndex[resultCount++] = i;
        } else {
            resultArray[i] = 0;
        }
    }
    result->count = resultCount;
}